

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O0

StringHashPair GeneratedSaxParser::Utils::calculateStringHashWithNamespace(ParserChar *text)

{
  StringHashPair SVar1;
  ulong uVar2;
  char *in_RDI;
  ParserChar *pos;
  StringHash g;
  StringHash h;
  StringHashPair pair;
  char *local_30;
  ulong local_20;
  pair<unsigned_long,_unsigned_long> local_10;
  
  local_20 = 0;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>(&local_10);
  local_10.first = 0;
  local_30 = in_RDI;
  while (*local_30 != '\0') {
    if ((*local_30 == ':') && (local_30[1] != '\0')) {
      local_10.first = local_20;
      local_20 = 0;
      local_30 = local_30 + 1;
    }
    local_20 = local_20 * 0x10 + (long)*local_30;
    uVar2 = local_20 & 0xf0000000;
    if (uVar2 != 0) {
      local_20 = uVar2 >> 0x18 ^ local_20;
    }
    local_20 = (uVar2 ^ 0xffffffffffffffff) & local_20;
    local_30 = local_30 + 1;
  }
  SVar1.second = local_20;
  SVar1.first = local_10.first;
  return SVar1;
}

Assistant:

StringHashPair Utils::calculateStringHashWithNamespace( const ParserChar* text )
    {
        StringHash h = 0;
        StringHash g;
        const ParserChar* pos = text;
        StringHashPair pair;
        pair.first = 0;

        while (*pos != 0) {
            if (*pos == ':' && pos[1] != 0) {
                pair.first = h;
                h = 0;
                pos++;
            }
            h = (h << 4) + *pos++;
            if ((g = (h & 0xf0000000)) != 0)
                h ^= g >> 24;
            h &= ~g;
        }
        pair.second = h;
        return pair;
    }